

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-ecc.c
# Opt level: O0

int ndn_ecdsa_sign(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
                  uint32_t output_max_size,ndn_ecc_prv_t *ecc_prv_key,uint32_t *output_used_size)

{
  int iVar1;
  uint8_t local_68 [8];
  uint8_t hash_result [32];
  uint32_t *output_used_size_local;
  ndn_ecc_prv_t *ecc_prv_key_local;
  uint32_t output_max_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  memset(local_68,0,0x20);
  iVar1 = ndn_sha256(input_value,input_size,local_68);
  if (iVar1 == 0) {
    input_value_local._4_4_ =
         (*ndn_ecc_backend.ecdsa_sign)
                   (local_68,0x20,output_value,output_max_size,&ecc_prv_key->abs_key,
                    ecc_prv_key->curve_type,output_used_size);
  }
  else {
    input_value_local._4_4_ = -0x19;
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_ecdsa_sign(const uint8_t* input_value, uint32_t input_size,
               uint8_t* output_value, uint32_t output_max_size,
               const ndn_ecc_prv_t* ecc_prv_key, uint32_t* output_used_size)
{
  uint8_t hash_result[NDN_SEC_SHA256_HASH_SIZE] = {0};
  if (ndn_sha256(input_value, input_size, hash_result) != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;

  return ndn_ecc_backend.ecdsa_sign(hash_result, sizeof(hash_result),
                                    output_value, output_max_size,
                                    &ecc_prv_key->abs_key,
                                    ecc_prv_key->curve_type, output_used_size);
}